

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall
KokkosTools::SpaceTimeStack::State::allocate
          (State *this,Space space,char *name,void *ptr,uint64_t size)

{
  Allocations *this_00;
  allocator<char> local_51;
  string local_50;
  
  this_00 = this->current_allocations + space;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  Allocations::allocate(this_00,&local_50,ptr,size,this->stack_frame);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->hwm_allocations[space].total_size < this_00->total_size) {
    Allocations::operator=(this->hwm_allocations + space,this_00);
  }
  return;
}

Assistant:

void allocate(Space space, const char* name, const void* ptr,
                std::uint64_t size) {
    current_allocations[space].allocate(std::string(name), ptr, size,
                                        stack_frame);
    if (current_allocations[space].total_size >
        hwm_allocations[space].total_size) {
      hwm_allocations[space] = current_allocations[space];
    }
  }